

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_chunked_sequence.cpp
# Opt level: O1

void __thiscall
CVIterator_Predecrement_Test<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>_>::
TestBody(CVIterator_Predecrement_Test<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>_>
         *this)

{
  int *piVar1;
  cseq_int *cv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  AssertionResult gtest_ar_1;
  TypeParam it;
  AssertHelper AStack_48;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  iterator_base<false> local_30;
  undefined1 local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->super_CVIterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>_>)
       .cv_.size_;
  local_30.chunk_it_._M_node._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_20,"this->cv_.size ()","4U",(unsigned_long *)&local_40,
             (uint *)&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xde,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  cv = &(this->super_CVIterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>_>
        ).cv_;
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  pstore::chunked_sequence<int,2ul,4ul,4ul>::
  end_impl<pstore::chunked_sequence<int,2ul,4ul,4ul>,pstore::chunked_sequence<int,2ul,4ul,4ul>::iterator_base<false>>
            ((chunked_sequence<int,2ul,4ul,4ul> *)local_20,cv);
  pbVar2 = local_18;
  if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_20 = *(undefined1 (*) [8])((long)local_20 + 8);
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((_List_node_base *)((long)local_20 + 0x10))->_M_next;
    if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0015b996;
  }
  local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&pbVar2[-1].field_2 + 0xf);
  piVar1 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk::operator[]
                     ((chunk *)((long)local_20 + 0x10),(size_t)local_18);
  local_30.chunk_it_._M_node._0_4_ = 7;
  testing::internal::CmpHelperEQ<int,int>((internal *)&local_40,"*it","7",piVar1,(int *)&local_30);
  if (local_40._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xe2,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_30.chunk_it_._M_node != (_List_node_base *)0x0) {
      (*(code *)(local_30.chunk_it_._M_node)->_M_next->_M_prev)();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  pbVar2 = local_18;
  if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_20 = *(undefined1 (*) [8])((long)local_20 + 8);
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((_List_node_base *)((long)local_20 + 0x10))->_M_next;
    if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0015b996;
  }
  local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&pbVar2[-1].field_2 + 0xf);
  piVar1 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk::operator[]
                     ((chunk *)((long)local_20 + 0x10),(size_t)local_18);
  local_30.chunk_it_._M_node._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>((internal *)&local_40,"*it","5",piVar1,(int *)&local_30);
  if (local_40._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xe4,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_30.chunk_it_._M_node != (_List_node_base *)0x0) {
      (*(code *)(local_30.chunk_it_._M_node)->_M_next->_M_prev)();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  pbVar2 = local_18;
  if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_20 = *(undefined1 (*) [8])((long)local_20 + 8);
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((_List_node_base *)((long)local_20 + 0x10))->_M_next;
    if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0015b996;
  }
  local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&pbVar2[-1].field_2 + 0xf);
  piVar1 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk::operator[]
                     ((chunk *)((long)local_20 + 0x10),(size_t)local_18);
  local_30.chunk_it_._M_node._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>((internal *)&local_40,"*it","3",piVar1,(int *)&local_30);
  if (local_40._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xe6,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_30.chunk_it_._M_node != (_List_node_base *)0x0) {
      (*(code *)(local_30.chunk_it_._M_node)->_M_next->_M_prev)();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  pbVar2 = local_18;
  if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_20 = *(undefined1 (*) [8])((long)local_20 + 8);
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((_List_node_base *)((long)local_20 + 0x10))->_M_next;
    if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_0015b996:
      pstore::assert_failed
                ("chunk_it_->size () > 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/chunked_sequence.hpp"
                 ,0x25b);
    }
  }
  local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&pbVar2[-1].field_2 + 0xf);
  piVar1 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk::operator[]
                     ((chunk *)((long)local_20 + 0x10),(size_t)local_18);
  local_30.chunk_it_._M_node._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>((internal *)&local_40,"*it","2",piVar1,(int *)&local_30);
  if (local_40._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xe8,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_30.chunk_it_._M_node != (_List_node_base *)0x0) {
      (*(code *)(local_30.chunk_it_._M_node)->_M_next->_M_prev)();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_30.chunk_it_._M_node =
       (cv->chunks_).
       super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_30.index_ = 0;
  testing::internal::
  CmpHelperEQ<pstore::chunked_sequence<int,2ul,4ul,4ul>::iterator_base<false>,pstore::chunked_sequence<int,2ul,4ul,4ul>::iterator_base<false>>
            ((internal *)&local_40,"it","this->cv_.begin ()",(iterator_base<false> *)local_20,
             &local_30);
  if (local_40._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xe9,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_30.chunk_it_._M_node != (_List_node_base *)0x0) {
      (*(code *)(local_30.chunk_it_._M_node)->_M_next->_M_prev)();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  return;
}

Assistant:

TYPED_TEST (CVIterator, Predecrement) {
    EXPECT_EQ (this->cv_.size (), 4U);

    TypeParam it = this->cv_.end ();
    --it;
    EXPECT_EQ (*it, 7);
    --it;
    EXPECT_EQ (*it, 5);
    --it;
    EXPECT_EQ (*it, 3);
    --it;
    EXPECT_EQ (*it, 2);
    EXPECT_EQ (it, this->cv_.begin ());
}